

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O0

Fxu_HeapDouble * Fxu_HeapDoubleStart(void)

{
  Fxu_HeapDouble *__s;
  Fxu_Double **ppFVar1;
  Fxu_HeapDouble *p;
  
  __s = (Fxu_HeapDouble *)malloc(0x18);
  memset(__s,0,0x18);
  __s->nItems = 0;
  __s->nItemsAlloc = 10000;
  ppFVar1 = (Fxu_Double **)malloc((long)(__s->nItemsAlloc + 1) << 3);
  __s->pTree = ppFVar1;
  *__s->pTree = (Fxu_Double *)0x0;
  return __s;
}

Assistant:

Fxu_HeapDouble * Fxu_HeapDoubleStart()
{
	Fxu_HeapDouble * p;
	p = ABC_ALLOC( Fxu_HeapDouble, 1 );
	memset( p, 0, sizeof(Fxu_HeapDouble) );
	p->nItems      = 0;
	p->nItemsAlloc = 10000;
	p->pTree       = ABC_ALLOC( Fxu_Double *, p->nItemsAlloc + 1 );
	p->pTree[0]    = NULL;
	return p;
}